

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_button_push_behavior(nk_context *ctx,nk_button_behavior behavior)

{
  int iVar1;
  nk_config_stack_button_behavior *pnVar2;
  nk_config_stack_button_behavior_element *pnVar3;
  nk_config_stack_button_behavior_element *element;
  nk_config_stack_button_behavior *button_stack;
  nk_button_behavior behavior_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4e72,
                  "int nk_button_push_behavior(struct nk_context *, enum nk_button_behavior)");
  }
  if (ctx == (nk_context *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar2 = &(ctx->stacks).button_behaviors;
    if (7 < pnVar2->head) {
      __assert_fail("button_stack->head < (int)(sizeof(button_stack->elements)/sizeof(button_stack->elements)[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x4e76,
                    "int nk_button_push_behavior(struct nk_context *, enum nk_button_behavior)");
    }
    if (pnVar2->head < 8) {
      iVar1 = pnVar2->head;
      pnVar2->head = iVar1 + 1;
      pnVar3 = (ctx->stacks).button_behaviors.elements + iVar1;
      pnVar3->address = &ctx->button_behavior;
      pnVar3->old_value = ctx->button_behavior;
      ctx->button_behavior = behavior;
      ctx_local._4_4_ = 1;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_button_push_behavior(struct nk_context *ctx, enum nk_button_behavior behavior)
{
    struct nk_config_stack_button_behavior *button_stack;
    struct nk_config_stack_button_behavior_element *element;

    NK_ASSERT(ctx);
    if (!ctx) return 0;

    button_stack = &ctx->stacks.button_behaviors;
    NK_ASSERT(button_stack->head < (int)NK_LEN(button_stack->elements));
    if (button_stack->head >= (int)NK_LEN(button_stack->elements))
        return 0;

    element = &button_stack->elements[button_stack->head++];
    element->address = &ctx->button_behavior;
    element->old_value = ctx->button_behavior;
    ctx->button_behavior = behavior;
    return 1;
}